

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# StdLib.cpp
# Opt level: O2

NULLCRef *
NULLC::AutoArrayAssignRev(NULLCRef *__return_storage_ptr__,NULLCRef left,NULLCAutoArray *right)

{
  undefined8 uVar1;
  int iVar2;
  uint uVar3;
  uint uVar4;
  char *pcVar5;
  char *pcVar6;
  
  if (right == (NULLCAutoArray *)0x0) {
    nullcThrowError("ERROR: null pointer access");
  }
  else {
    pcVar5 = left.ptr;
    if (left.typeID == 0xf) {
      uVar1 = *(undefined8 *)((long)&right->ptr + 4);
      *(undefined8 *)pcVar5 = *(undefined8 *)right;
      *(undefined8 *)(pcVar5 + 8) = uVar1;
    }
    else {
      iVar2 = nullcIsArray(left.typeID);
      if (iVar2 == 0) {
        pcVar5 = nullcGetTypeName(left.typeID);
        nullcThrowError("ERROR: cannot convert from \'auto[]\' to \'%s\'",pcVar5);
      }
      else {
        uVar3 = nullcGetSubType(0);
        uVar4 = right->typeID;
        if (uVar3 == uVar4) {
          uVar4 = nullcGetArraySize(left.typeID);
          if (uVar4 == 0xffffffff) {
            *(uint *)(pcVar5 + 8) = right->len;
            *(char **)pcVar5 = right->ptr;
LAB_00201473:
            *(undefined4 *)((long)&__return_storage_ptr__->ptr + 4) = left.ptr._4_4_;
            *(long *)__return_storage_ptr__ = left._0_8_;
            return __return_storage_ptr__;
          }
          if (uVar4 == right->len) {
            pcVar6 = right->ptr;
            uVar3 = nullcGetTypeSize(right->typeID);
            memcpy(pcVar5,pcVar6,(ulong)(uVar4 * uVar3));
            goto LAB_00201473;
          }
          uVar4 = right->typeID;
        }
        pcVar5 = nullcGetTypeName(uVar4);
        uVar4 = right->len;
        pcVar6 = nullcGetTypeName(left.typeID);
        nullcThrowError("ERROR: cannot convert from \'auto[]\' (actual type \'%s[%d]\') to \'%s\'",
                        pcVar5,(ulong)uVar4,pcVar6);
      }
    }
  }
  *(undefined4 *)((long)&__return_storage_ptr__->ptr + 4) = 0;
  *(undefined8 *)__return_storage_ptr__ = 0;
  return __return_storage_ptr__;
}

Assistant:

NULLCRef NULLC::AutoArrayAssignRev(NULLCRef left, NULLCAutoArray *right)
{
	NULLCRef ret = { 0, 0 };

	if(!right)
	{
		nullcThrowError("ERROR: null pointer access");
		return ret;
	}
	if(left.typeID == NULLC_TYPE_AUTO_ARRAY)
	{
		*(NULLCAutoArray*)left.ptr = *right;
		return ret;
	}
	if(!nullcIsArray(left.typeID))
	{
		nullcThrowError("ERROR: cannot convert from 'auto[]' to '%s'", nullcGetTypeName(left.typeID));
		return ret;
	}
	if(nullcGetSubType(left.typeID) != right->typeID)
	{
		nullcThrowError("ERROR: cannot convert from 'auto[]' (actual type '%s[%d]') to '%s'", nullcGetTypeName(right->typeID), right->len, nullcGetTypeName(left.typeID));
		return ret;
	}

	unsigned int leftLength = nullcGetArraySize(left.typeID);

	if(leftLength == ~0u)
	{
		NULLCArray *arr = (NULLCArray*)left.ptr;
		arr->len = right->len;
		arr->ptr = right->ptr;
	}else{
		if(leftLength != right->len)
		{
			nullcThrowError("ERROR: cannot convert from 'auto[]' (actual type '%s[%d]') to '%s'", nullcGetTypeName(right->typeID), right->len, nullcGetTypeName(left.typeID));
			return ret;
		}
		memcpy(left.ptr, right->ptr, unsigned(leftLength * nullcGetTypeSize(right->typeID)));
	}

	return left;
}